

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::get_tess_factor_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_a;
  allocator local_9;
  
  bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
  if (bVar1) {
    pcVar3 = "MTLTriangleTessellationFactorsHalf";
    paVar2 = &local_9;
  }
  else {
    pcVar3 = "MTLQuadTessellationFactorsHalf";
    paVar2 = &local_a;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerMSL::get_tess_factor_struct_name()
{
	if (is_tessellating_triangles())
		return "MTLTriangleTessellationFactorsHalf";
	return "MTLQuadTessellationFactorsHalf";
}